

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlf.h
# Opt level: O0

void __thiscall TLF<4U>::TLF(TLF<4U> *this,int num,int _HIT)

{
  undefined4 in_EDX;
  int in_ESI;
  undefined8 *in_RDI;
  Abstract<4U> *in_stack_ffffffffffffffc0;
  
  Abstract<4U>::Abstract(in_stack_ffffffffffffffc0);
  *in_RDI = &PTR_Init_00123bc0;
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x110b2d);
  std::
  unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
  ::unordered_map((unordered_map<Data<4U>,_int,_My_Hash<4U>,_std::equal_to<Data<4U>_>,_std::allocator<std::pair<const_Data<4U>,_int>_>_>
                   *)0x110b43);
  std::
  unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
  ::unordered_map((unordered_map<Stream<4U>,_int,_Stream_Hash<4U>,_std::equal_to<Stream<4U>_>,_std::allocator<std::pair<const_Stream<4U>,_int>_>_>
                   *)0x110b59);
  *(undefined4 *)(in_RDI + 0xd) = in_EDX;
  in_RDI[6] = 0;
  in_RDI[5] = 0;
  in_RDI[8] = 0;
  in_RDI[7] = 0;
  std::__cxx11::string::operator=((string *)(in_RDI + 1),"TLF");
  std::__cxx11::string::operator=((string *)(in_RDI + 9),"\t\t\t");
  in_RDI[0xe] = (double)(in_ESI / 100000) * 0.001;
  return;
}

Assistant:

TLF(int num, int _HIT) {
		this->HIT = _HIT;
		this->aae = this->are = this->pr = this->cr = 0;
		this->name = "TLF";
		this->sep = "\t\t\t";
		epsilon = num / 100000 * 0.001;
	}